

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O1

double HTS_lsp2en(HTS_Vocoder *v,double *lsp,size_t m,double alpha)

{
  size_t sVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int m_00;
  double dVar7;
  
  if (v->spectrum2en_size < m) {
    if (v->spectrum2en_buff != (double *)0x0) {
      HTS_free(v->spectrum2en_buff);
    }
    pdVar3 = (double *)HTS_calloc(m + 0x241,8);
    v->spectrum2en_buff = pdVar3;
    v->spectrum2en_size = m;
  }
  pdVar3 = v->spectrum2en_buff;
  m_00 = (int)m;
  HTS_lsp2lpc(v,lsp + 1,pdVar3,m_00);
  dVar7 = *lsp;
  if (v->use_log_gain != '\0') {
    dVar7 = exp(dVar7);
  }
  pdVar2 = v->spectrum2en_buff;
  *pdVar2 = dVar7;
  HTS_ignorm(pdVar2,pdVar2,m_00,v->gamma);
  if (m != 0) {
    sVar1 = v->stage;
    pdVar2 = v->spectrum2en_buff;
    uVar5 = 2;
    if (2 < m + 1) {
      uVar5 = m + 1;
    }
    uVar6 = 1;
    do {
      pdVar2[uVar6] =
           pdVar2[uVar6] *
           -(((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  HTS_mgc2mgc(v,v->spectrum2en_buff,m_00,alpha,v->gamma,pdVar3 + m + 1,0x23f,0.0,1.0);
  dVar7 = 0.0;
  lVar4 = 1;
  do {
    dVar7 = dVar7 + pdVar3[m + lVar4] * pdVar3[m + lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x241);
  return dVar7;
}

Assistant:

static double HTS_lsp2en(HTS_Vocoder * v, double *lsp, size_t m, double alpha)
{
   size_t i;
   double en = 0.0;
   double *buff;

   if (v->spectrum2en_size < m) {
      if (v->spectrum2en_buff != NULL)
         HTS_free(v->spectrum2en_buff);
      v->spectrum2en_buff = (double *) HTS_calloc(m + 1 + IRLENG, sizeof(double));
      v->spectrum2en_size = m;
   }
   buff = v->spectrum2en_buff + m + 1;

   /* lsp2lpc */
   HTS_lsp2lpc(v, lsp + 1, v->spectrum2en_buff, m);
   if (v->use_log_gain)
      v->spectrum2en_buff[0] = exp(lsp[0]);
   else
      v->spectrum2en_buff[0] = lsp[0];

   /* mgc2mgc */
   if (NORMFLG1)
      HTS_ignorm(v->spectrum2en_buff, v->spectrum2en_buff, m, v->gamma);
   else if (MULGFLG1)
      v->spectrum2en_buff[0] = (1.0 - v->spectrum2en_buff[0]) * ((double) v->stage);
   if (MULGFLG1)
      for (i = 1; i <= m; i++)
         v->spectrum2en_buff[i] *= -((double) v->stage);
   HTS_mgc2mgc(v, v->spectrum2en_buff, m, alpha, v->gamma, buff, IRLENG - 1, 0.0, 1);

   for (i = 0; i < IRLENG; i++)
      en += buff[i] * buff[i];
   return en;
}